

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

boolean snuff_lit(obj *obj)

{
  boolean bVar1;
  char *pcVar2;
  char *pcVar3;
  char local_1a;
  char local_19;
  xchar y;
  obj *poStack_18;
  xchar x;
  obj *obj_local;
  
  if ((*(uint *)&obj->field_0x4a >> 0x13 & 1) == 0) {
    return '\0';
  }
  poStack_18 = obj;
  if ((((obj->otyp != 0xe8) && (obj->otyp != 0xe9)) && (obj->otyp != 0xe7)) && (obj->otyp != 0x142))
  {
    bVar1 = snuff_candle(obj);
    if (bVar1 == '\0') {
      return '\0';
    }
    return '\x01';
  }
  get_obj_location(obj,&local_19,&local_1a,0);
  if (poStack_18->where == '\x04') {
    if ((viz_array[local_1a][local_19] & 2U) == 0) goto LAB_00147589;
  }
  else if ((((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (((youmonst.data)->mflags1 & 0x1000) != 0)) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) goto LAB_00147589;
  pcVar2 = Yname2(poStack_18);
  pcVar3 = otense(poStack_18,"go");
  pline("%s %s out!",pcVar2,pcVar3);
LAB_00147589:
  end_burn(poStack_18,'\x01');
  return '\x01';
}

Assistant:

boolean snuff_lit(struct obj *obj)
{
	xchar x, y;

	if (obj->lamplit) {
	    if (obj->otyp == OIL_LAMP || obj->otyp == MAGIC_LAMP ||
		    obj->otyp == BRASS_LANTERN || obj->otyp == POT_OIL) {
		get_obj_location(obj, &x, &y, 0);
		if (obj->where == OBJ_MINVENT ? cansee(x,y) : !Blind)
		    pline("%s %s out!", Yname2(obj), otense(obj, "go"));
		end_burn(obj, TRUE);
		return TRUE;
	    }
	    if (snuff_candle(obj)) return TRUE;
	}
	return FALSE;
}